

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::eqI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Literal *other_local;
  Literal *this_local;
  
  compare<8,_&wasm::Literal::getLanesUI16x8,_&wasm::Literal::eq,_int>
            (__return_storage_ptr__,this,other);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::eqI16x8(const Literal& other) const {
  return compare<8, &Literal::getLanesUI16x8, &Literal::eq>(*this, other);
}